

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::DepthRangeTests::init(DepthRangeTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Context *pCVar3;
  pointer pcVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long lVar7;
  
  if (init()::cases == '\0') {
    init((EVP_PKEY_CTX *)this);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write",
             "gl_FragDepth write tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar7 = 0;
  do {
    pTVar6 = (TestNode *)operator_new(0x88);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)(&init::cases[0].depthCoord + 1) + lVar7);
    uVar2 = *(undefined4 *)((long)(&init::cases[0].depthCoord + 1) + lVar7 + 4);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,pCVar3->m_testCtx,
               *(char **)((long)&((anon_struct_40_5_8aa28cec *)(&init::cases[0].depthCoord + -1))->
                                 name + lVar7),
               *(char **)((long)init::cases[0].depthCoord.m_data + lVar7 + -8));
    pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__DepthRangeWriteCase_02169c10;
    pTVar6[1].m_testCtx = (TestContext *)((long)init::cases[0].depthCoord.m_data + lVar7);
    *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = uVar1;
    *(undefined4 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = uVar2;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0x230);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compare",
             "gl_FragDepth used with depth comparison");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar7 = 0x24;
  do {
    pTVar6 = (TestNode *)operator_new(0x98);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)(lVar7 + 0x2287a4c);
    uVar2 = *(undefined4 *)
             ((long)&((anon_struct_40_5_8aa28cec *)(&init::cases[0].depthCoord + -1))->name + lVar7)
    ;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,pCVar3->m_testCtx,
               *(char **)((long)BlendCase::init::baseGradientColors[2].m_data + lVar7 + 0xc),
               *(char **)((long)BlendCase::init::baseGradientColors[3].m_data + lVar7 + 4));
    pTVar6[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__DepthRangeCompareCase_02169bd8;
    pcVar4 = *(pointer *)(lVar7 + 0x2287a44);
    pTVar6[1].m_testCtx =
         *(TestContext **)((long)BlendCase::init::baseGradientColors[3].m_data + lVar7 + 0xc);
    pTVar6[1].m_name._M_dataplus._M_p = pcVar4;
    *(undefined4 *)&pTVar6[1].m_name._M_string_length = uVar1;
    *(undefined4 *)((long)&pTVar6[1].m_name._M_string_length + 4) = uVar2;
    *(undefined4 *)&pTVar6[1].m_name.field_2 = 0x201;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0x254);
  return extraout_EAX;
}

Assistant:

void DepthRangeTests::init (void)
{
	static const struct
	{
		const char*			name;
		const char*			desc;
		const tcu::Vec4		depthCoord;
		const float			zNear;
		const float			zFar;
	} cases[] =
	{
		{ "default",		"Default depth range",		tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		1.0f },
		{ "reverse",		"Reversed default range",	tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f,		0.0f },
		{ "zero_to_half",	"From 0 to 0.5",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		0.5f },
		{ "half_to_one",	"From 0.5 to 1",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.5f,		1.0f },
		{ "half_to_zero",	"From 0.5 to 0",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.5f,		0.0f },
		{ "one_to_half",	"From 1 to 0.5",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f,		0.5f },
		{ "third_to_0_8",	"From 1/3 to 0.8",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f/3.0f,	0.8f },
		{ "0_8_to_third",	"From 0.8 to 1/3",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.8f,		1.0f/3.0f },
		{ "zero_to_zero",	"From 0 to 0",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		0.0f },
		{ "half_to_half",	"From 0.5 to 0.5",			tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.5f,		0.5f },
		{ "one_to_one",		"From 1 to 1",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	1.0f,		1.0f },
		{ "clamp_near",		"From -1 to 1",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	-1.0f,		1.0f },
		{ "clamp_far",		"From 0 to 2",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	0.0f,		2.0 },
		{ "clamp_both",		"From -1 to 2",				tcu::Vec4(-1.0f, 0.2f, -0.3f, 1.0f),	-1.0,		2.0 }
	};

	// .write
	tcu::TestCaseGroup* writeGroup = new tcu::TestCaseGroup(m_testCtx, "write", "gl_FragDepth write tests");
	addChild(writeGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		writeGroup->addChild(new DepthRangeWriteCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].depthCoord, cases[ndx].zNear, cases[ndx].zFar));

	// .compare
	tcu::TestCaseGroup* compareGroup = new tcu::TestCaseGroup(m_testCtx, "compare", "gl_FragDepth used with depth comparison");
	addChild(compareGroup);
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		compareGroup->addChild(new DepthRangeCompareCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].depthCoord, cases[ndx].zNear, cases[ndx].zFar, GL_LESS));
}